

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestExpectation.cpp
# Opt level: O1

void __thiscall psy::C::Ty::Ty(Ty *this,Decl *Decl)

{
  this->decl_ = Decl;
  (this->ident_)._M_dataplus._M_p = (pointer)&(this->ident_).field_2;
  (this->ident_)._M_string_length = 0;
  (this->ident_).field_2._M_local_buf[0] = '\0';
  this->CVR_ = None;
  (this->derivTyKs_).super__Vector_base<TypeKind,_std::allocator<TypeKind>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->derivTyKs_).super__Vector_base<TypeKind,_std::allocator<TypeKind>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->derivTyKs_).super__Vector_base<TypeKind,_std::allocator<TypeKind>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->derivTyCVRs_).super__Vector_base<psy::C::CVR,_std::allocator<psy::C::CVR>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->derivTyCVRs_).super__Vector_base<psy::C::CVR,_std::allocator<psy::C::CVR>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->derivTyCVRs_).super__Vector_base<psy::C::CVR,_std::allocator<psy::C::CVR>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->derivPtrTyDecay_).super__Vector_base<psy::C::Decay,_std::allocator<psy::C::Decay>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->derivPtrTyDecay_).super__Vector_base<psy::C::Decay,_std::allocator<psy::C::Decay>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->derivPtrTyDecay_).super__Vector_base<psy::C::Decay,_std::allocator<psy::C::Decay>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nestedRetTy_).super___shared_ptr<psy::C::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->nestedRetTy_).super___shared_ptr<psy::C::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->parmsTys_).super__Vector_base<psy::C::Ty,_std::allocator<psy::C::Ty>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->parmsTys_).super__Vector_base<psy::C::Ty,_std::allocator<psy::C::Ty>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->parmsTys_).super__Vector_base<psy::C::Ty,_std::allocator<psy::C::Ty>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Ty::Ty(Decl& Decl)
    : decl_(Decl)
    , CVR_(CVR::None)
    , nestedRetTy_(nullptr)
{}